

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ebmlmain.c
# Opt level: O0

uint8_t EBML_CodedValueLengthSigned(filepos_t Length,size_t CodedSize,uint8_t *OutBuffer)

{
  uint8_t uVar1;
  uint8_t *OutBuffer_local;
  size_t CodedSize_local;
  filepos_t Length_local;
  
  if ((Length < -0x3f) || (0x3f < Length)) {
    if ((Length < -0x1fff) || (0x1fff < Length)) {
      if ((Length < -0xfffff) || (0xfffff < Length)) {
        CodedSize_local = Length;
        if ((-0x8000000 < Length) && (Length < 0x8000000)) {
          CodedSize_local = Length + 0x7ffffff;
        }
      }
      else {
        CodedSize_local = Length + 0xfffff;
      }
    }
    else {
      CodedSize_local = Length + 0x1fff;
    }
  }
  else {
    CodedSize_local = Length + 0x3f;
  }
  uVar1 = EBML_CodedValueLength(CodedSize_local,CodedSize,OutBuffer,1);
  return uVar1;
}

Assistant:

uint8_t EBML_CodedValueLengthSigned(filepos_t Length, size_t CodedSize, uint8_t * OutBuffer)
{
    if (Length > -64 && Length < 64) // 2^6
        Length += 63;
    else if (Length > -8192 && Length < 8192) // 2^13
        Length += 8191;
    else if (Length > -1048576 && Length < 1048576) // 2^20
        Length += 1048575;
    else if (Length > -134217728 && Length < 134217728) // 2^27
        Length += 134217727;

    return EBML_CodedValueLength(Length, CodedSize, OutBuffer, 1);
}